

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall
QLocaleData::exponentForm
          (QLocaleData *this,QString *digits,int decpt,int precision,PrecisionMode pm,
          bool mustMarkDecimal,int minExponentDigits)

{
  QLocaleData *this_00;
  qsizetype qVar1;
  QLocaleData *in_RDX;
  QString *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  qsizetype i_1;
  qsizetype i;
  qsizetype digitWidth;
  QString zero;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffeec;
  QString *in_stack_fffffffffffffef0;
  QLocaleData *in_stack_fffffffffffffef8;
  QString *in_stack_ffffffffffffff00;
  QLocaleData *in_stack_ffffffffffffff08;
  QLocaleData *i_00;
  QLocaleData *this_01;
  long local_c0;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  long in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffffc0;
  QString local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  zeroDigit(in_stack_ffffffffffffff08);
  this_00 = (QLocaleData *)QString::size(&local_28);
  if (in_R9D == 1) {
    qVar1 = QString::size((QString *)in_RDX);
    for (in_stack_ffffffffffffff58 = qVar1 / (long)this_00; in_stack_ffffffffffffff58 < in_R8D + 1;
        in_stack_ffffffffffffff58 = in_stack_ffffffffffffff58 + 1) {
      QString::append((QString *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    }
  }
  else if (in_R9D == 2) {
    qVar1 = QString::size((QString *)in_RDX);
    for (local_c0 = qVar1 / (long)this_00; local_c0 < in_R8D; local_c0 = local_c0 + 1) {
      QString::append((QString *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    }
  }
  this_01 = this_00;
  if (((in_stack_00000008 & 1) != 0) ||
     (qVar1 = QString::size((QString *)in_RDX), this_01 = this_00, (long)this_00 < qVar1)) {
    i_00 = in_RDX;
    this_00 = this_01;
    decimalPoint(in_RDX);
    QString::insert((QString *)this_01,(qsizetype)i_00,in_stack_ffffffffffffff00);
    QString::~QString((QString *)0x4d624a);
  }
  exponentSeparator(in_stack_fffffffffffffef8);
  QString::append((QString *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  QString::~QString((QString *)0x4d62b2);
  uVar2 = 0x10;
  longLongToString(this_00,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                   in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffffc0);
  QString::append((QString *)in_RDX,in_stack_fffffffffffffef0);
  QString::~QString((QString *)0x4d631c);
  QString::QString(in_stack_fffffffffffffef0,(QString *)CONCAT44(in_stack_fffffffffffffeec,uVar2));
  QString::~QString((QString *)0x4d633b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocaleData::exponentForm(QString &&digits, int decpt, int precision,
                                  PrecisionMode pm, bool mustMarkDecimal,
                                  int minExponentDigits) const
{
    const QString zero = zeroDigit();
    const auto digitWidth = zero.size();
    Q_ASSERT(digitWidth == 1 || digitWidth == 2);
    Q_ASSERT(digits.size() % digitWidth == 0);

    switch (pm) {
    case PMDecimalDigits:
        for (qsizetype i = digits.size() / digitWidth; i < precision + 1; ++i)
            digits.append(zero);
        break;
    case PMSignificantDigits:
        for (qsizetype i = digits.size() / digitWidth; i < precision; ++i)
            digits.append(zero);
        break;
    case PMChopTrailingZeros:
        Q_ASSERT(digits.size() / digitWidth <= 1 || !digits.endsWith(zero));
        break;
    }

    if (mustMarkDecimal || digits.size() > digitWidth)
        digits.insert(digitWidth, decimalPoint());

    digits.append(exponentSeparator());
    digits.append(longLongToString(decpt - 1, minExponentDigits, 10, -1, AlwaysShowSign));

    return std::move(digits);
}